

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalValue.h
# Opt level: O0

bool * __thiscall jbcoin::LocalValue<bool>::operator*(LocalValue<bool> *this)

{
  bool bVar1;
  int iVar2;
  thread_specific_ptr<jbcoin::detail::LocalValues> *ptVar3;
  _Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
  this_00;
  undefined4 extraout_var;
  unordered_map<void_const*,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>,std::hash<void_const*>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>>>
  *this_01;
  pointer ppVar4;
  pointer pBVar5;
  undefined4 extraout_var_00;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false,_false>,_bool>
  pVar6;
  unique_ptr<jbcoin::detail::LocalValues::Value<bool>,_std::default_delete<jbcoin::detail::LocalValues::Value<bool>_>_>
  local_58;
  LocalValue<bool> *local_50;
  _Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
  local_48;
  undefined1 local_40;
  _Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
  local_38;
  LocalValue<bool> *local_30;
  _Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
  local_28;
  iterator iter;
  LocalValues *lvs;
  LocalValue<bool> *this_local;
  
  ptVar3 = jbcoin::detail::getLocalValues<void>();
  iter.
  super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
             )boost::thread_specific_ptr<jbcoin::detail::LocalValues>::get(ptVar3);
  if (iter.
      super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    this_00._M_cur = (__node_type *)operator_new(0x40);
    memset(this_00._M_cur,0,0x40);
    jbcoin::detail::LocalValues::LocalValues((LocalValues *)this_00._M_cur);
    *(bool *)&((this_00._M_cur)->super__Hash_node_base)._M_nxt = false;
    iter.
    super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
               )(_Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                 )this_00._M_cur;
    ptVar3 = jbcoin::detail::getLocalValues<void>();
    boost::thread_specific_ptr<jbcoin::detail::LocalValues>::reset
              (ptVar3,(LocalValues *)
                      iter.
                      super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                      ._M_cur);
  }
  else {
    local_30 = this;
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<const_void_*,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>_>_>
         ::find((unordered_map<const_void_*,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>_>_>
                 *)&((__node_type *)
                    iter.
                    super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                    ._M_cur)->
                    super__Hash_node_value<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                ,&local_30);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<const_void_*,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>_>_>
         ::end((unordered_map<const_void_*,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>_>_>
                *)((long)iter.
                         super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                         ._M_cur + 8));
    bVar1 = std::__detail::operator!=(&local_28,&local_38);
    if (bVar1) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false,_false>
                             *)&local_28);
      pBVar5 = std::
               unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>
               ::operator->(&ppVar4->second);
      iVar2 = (*pBVar5->_vptr_BasicValue[2])();
      return (bool *)CONCAT44(extraout_var,iVar2);
    }
  }
  this_01 = (unordered_map<void_const*,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>,std::hash<void_const*>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>>>
             *)((long)iter.
                      super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
                      ._M_cur + 8);
  local_50 = this;
  std::make_unique<jbcoin::detail::LocalValues::Value<bool>,bool&>((bool *)&local_58);
  pVar6 = std::
          unordered_map<void_const*,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>,std::hash<void_const*>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,std::default_delete<jbcoin::detail::LocalValues::BasicValue>>>>>
          ::
          emplace<jbcoin::LocalValue<bool>*,std::unique_ptr<jbcoin::detail::LocalValues::Value<bool>,std::default_delete<jbcoin::detail::LocalValues::Value<bool>>>>
                    (this_01,&local_50,&local_58);
  local_48._M_cur =
       (__node_type *)
       pVar6.first.
       super__Node_iterator_base<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false>
       ._M_cur;
  local_40 = pVar6.second;
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_void_*const,_std::unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>_>,_false,_false>
                         *)&local_48);
  pBVar5 = std::
           unique_ptr<jbcoin::detail::LocalValues::BasicValue,_std::default_delete<jbcoin::detail::LocalValues::BasicValue>_>
           ::operator->(&ppVar4->second);
  iVar2 = (*pBVar5->_vptr_BasicValue[2])();
  std::
  unique_ptr<jbcoin::detail::LocalValues::Value<bool>,_std::default_delete<jbcoin::detail::LocalValues::Value<bool>_>_>
  ::~unique_ptr(&local_58);
  return (bool *)CONCAT44(extraout_var_00,iVar2);
}

Assistant:

T&
LocalValue<T>::operator*()
{
    auto lvs = detail::getLocalValues().get();
    if (! lvs)
    {
        lvs = new detail::LocalValues();
        lvs->onCoro = false;
        detail::getLocalValues().reset(lvs);
    }
    else
    {
        auto const iter = lvs->values.find(this);
        if (iter != lvs->values.end())
            return *reinterpret_cast<T*>(iter->second->get());
    }

    return *reinterpret_cast<T*>(lvs->values.emplace(this,
        std::make_unique<detail::LocalValues::Value<T>>(t_)).
            first->second->get());
}